

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objtracker.cpp
# Opt level: O0

void CObjectTracker::ReportHelper(string *label,CTracker *tracker,ostream *os)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ostream *poVar4;
  void *pvVar5;
  ostream *in_RDX;
  ulong *in_RSI;
  string *in_RDI;
  size_t numReleases;
  size_t numRetains;
  size_t numAllocations;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar1 = *in_RSI;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar2 = in_RSI[1];
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar3 = in_RSI[2];
  if (uVar3 < uVar1 + uVar2) {
    poVar4 = std::operator<<(in_RDX,"Possible leak of type ");
    poVar4 = std::operator<<(poVar4,in_RDI);
    poVar4 = std::operator<<(poVar4,"!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(in_RDX,"    Number of Allocations: ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar1);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(in_RDX,"    Number of Retains:     ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar2);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(in_RDX,"    Number of Releases:    ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar3);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  else if (uVar1 + uVar2 < uVar3) {
    poVar4 = std::operator<<(in_RDX,"Unexpected counts for type ");
    poVar4 = std::operator<<(poVar4,in_RDI);
    poVar4 = std::operator<<(poVar4,"!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(in_RDX,"    Number of Allocations: ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar1);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(in_RDX,"    Number of Retains:     ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar2);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(in_RDX,"    Number of Releases:    ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar3);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  else if (uVar1 != 0) {
    poVar4 = std::operator<<(in_RDX,"No ");
    poVar4 = std::operator<<(poVar4,in_RDI);
    poVar4 = std::operator<<(poVar4," leaks detected.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void CObjectTracker::ReportHelper(
    const std::string& label,
    const CObjectTracker::CTracker& tracker,
    std::ostream& os )
{
    size_t  numAllocations = tracker.NumAllocations.load(std::memory_order_relaxed);
    size_t  numRetains = tracker.NumRetains.load(std::memory_order_relaxed);
    size_t  numReleases = tracker.NumReleases.load(std::memory_order_relaxed);

    if( numReleases < numAllocations + numRetains )
    {
        os << "Possible leak of type " << label << "!" << std::endl;
        os << "    Number of Allocations: " << numAllocations << std::endl;
        os << "    Number of Retains:     " << numRetains << std::endl;
        os << "    Number of Releases:    " << numReleases << std::endl;
    }
    else if( numReleases > numAllocations + numRetains )
    {
        // If there are more releases than allocations or retains then this
        // is an unexpected situation.  It usually means that some allocations
        // aren't tracked correctly, or that a retain or release returned
        // an error.
        os << "Unexpected counts for type " << label << "!" << std::endl;
        os << "    Number of Allocations: " << numAllocations << std::endl;
        os << "    Number of Retains:     " << numRetains << std::endl;
        os << "    Number of Releases:    " << numReleases << std::endl;
    }
    else if( numAllocations )
    {
        os << "No " << label << " leaks detected." << std::endl;
    }
}